

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method.cpp
# Opt level: O0

void __thiscall cppgenerate::Method::Method(Method *this)

{
  allocator local_11;
  Method *local_10;
  Method *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_returnType,"void",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::__cxx11::string::string((string *)&this->m_documentation);
  std::vector<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>::vector
            (&this->m_arguments);
  CodeBlock::CodeBlock(&this->m_code);
  this->m_access = PRIVATE;
  this->m_isStatic = false;
  this->m_isVirtual = false;
  this->m_isPureVirtual = false;
  CodeBlock::setIndent(&this->m_code,4);
  return;
}

Assistant:

Method::Method() : 
    m_returnType( "void" ),
    m_access( cppgenerate::AccessModifier::PRIVATE ),
    m_isVirtual( false ),
    m_isPureVirtual( false ),
    m_isStatic( false ){
    m_code.setIndent( 4 );
}